

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall
re2::Compiler::PostVisit
          (Compiler *this,Regexp *re,Frag param_2,Frag param_3,Frag *child_frags,int nchild_frags)

{
  iterator pRVar1;
  uint32 uVar2;
  bool bVar3;
  RegexpOp RVar4;
  int iVar5;
  ParseFlags PVar6;
  Rune RVar7;
  Frag FVar8;
  Frag FVar9;
  Rune *pRVar10;
  iterator pRVar11;
  ostream *poVar12;
  EmptyOp EVar13;
  LogMessage local_408;
  Frag local_284;
  bool local_279;
  iterator pRStack_278;
  bool fold;
  iterator i_3;
  bool foldascii;
  LogMessage local_260;
  CharClass *local_e0;
  CharClass *cc;
  Frag local_d0;
  Frag local_c8;
  Frag local_c0;
  Frag f1;
  int i_2;
  int local_84;
  int i_1;
  int local_68;
  int i;
  int nchild_frags_local;
  Frag *child_frags_local;
  Regexp *re_local;
  Compiler *this_local;
  Frag param_3_local;
  Frag param_2_local;
  Frag f;
  
  if ((this->failed_ & 1U) == 0) {
    RVar4 = Regexp::op(re);
    switch(RVar4) {
    case kRegexpNoMatch:
      param_2_local = NoMatch(this);
      break;
    case kRegexpEmptyMatch:
      param_2_local = Nop(this);
      break;
    case kRegexpLiteral:
      RVar7 = Regexp::rune(re);
      PVar6 = Regexp::parse_flags(re);
      PVar6 = operator&(PVar6,FoldCase);
      param_2_local = Literal(this,RVar7,PVar6 != NoParseFlags);
      break;
    case kRegexpLiteralString:
      iVar5 = Regexp::nrunes(re);
      if (iVar5 == 0) {
        param_2_local = Nop(this);
      }
      else {
        Frag::Frag(&param_2_local);
        for (f1.begin = 0; uVar2 = f1.begin, iVar5 = Regexp::nrunes(re), (int)uVar2 < iVar5;
            f1.begin = f1.begin + 1) {
          pRVar10 = Regexp::runes(re);
          RVar7 = pRVar10[(int)f1.begin];
          PVar6 = Regexp::parse_flags(re);
          PVar6 = operator&(PVar6,FoldCase);
          local_c0 = Literal(this,RVar7,PVar6 != NoParseFlags);
          FVar8 = local_c0;
          if (f1.begin != 0) {
            local_d0 = param_2_local;
            cc = (CharClass *)local_c0;
            local_c8 = Cat(this,param_2_local,local_c0);
            FVar8 = local_c8;
          }
          param_2_local = FVar8;
        }
      }
      break;
    case kRegexpConcat:
      param_2_local = *child_frags;
      for (local_68 = 1; local_68 < nchild_frags; local_68 = local_68 + 1) {
        param_2_local = Cat(this,param_2_local,child_frags[local_68]);
      }
      break;
    case kRegexpAlternate:
      param_2_local = *child_frags;
      for (local_84 = 1; local_84 < nchild_frags; local_84 = local_84 + 1) {
        param_2_local = Alt(this,param_2_local,child_frags[local_84]);
      }
      break;
    case kRegexpStar:
      FVar8 = *child_frags;
      PVar6 = Regexp::parse_flags(re);
      PVar6 = operator&(PVar6,NonGreedy);
      param_2_local = Star(this,FVar8,PVar6 != NoParseFlags);
      break;
    case kRegexpPlus:
      FVar8 = *child_frags;
      PVar6 = Regexp::parse_flags(re);
      PVar6 = operator&(PVar6,NonGreedy);
      param_2_local = Plus(this,FVar8,PVar6 != NoParseFlags);
      break;
    case kRegexpQuest:
      unique0x00012000 = *child_frags;
      PVar6 = Regexp::parse_flags(re);
      PVar6 = operator&(PVar6,NonGreedy);
      param_2_local = Quest(this,stack0xffffffffffffff4c,PVar6 != NoParseFlags);
      break;
    case kRegexpRepeat:
    default:
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_408,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/compile.cc",
                 0x3dd);
      poVar12 = LogMessage::stream(&local_408);
      poVar12 = std::operator<<(poVar12,"Missing case in Compiler: ");
      RVar4 = Regexp::op(re);
      std::ostream::operator<<(poVar12,RVar4);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_408);
      this->failed_ = true;
      param_2_local = NoMatch(this);
      break;
    case kRegexpCapture:
      iVar5 = Regexp::cap(re);
      if (iVar5 < 0) {
        param_2_local = *child_frags;
      }
      else {
        local_284 = *child_frags;
        iVar5 = Regexp::cap(re);
        param_2_local = Capture(this,local_284,iVar5);
      }
      break;
    case kRegexpAnyChar:
      BeginRange(this);
      AddRuneRange(this,0,0x10ffff,false);
      param_2_local = EndRange(this);
      break;
    case kRegexpAnyByte:
      param_2_local = ByteRange(this,0,0xff,false);
      break;
    case kRegexpBeginLine:
      EVar13 = kEmptyBeginLine;
      if ((this->reversed_ & 1U) != 0) {
        EVar13 = kEmptyEndLine;
      }
      param_2_local = EmptyWidth(this,EVar13);
      break;
    case kRegexpEndLine:
      EVar13 = kEmptyEndLine;
      if ((this->reversed_ & 1U) != 0) {
        EVar13 = kEmptyBeginLine;
      }
      param_2_local = EmptyWidth(this,EVar13);
      break;
    case kRegexpWordBoundary:
      param_2_local = EmptyWidth(this,kEmptyWordBoundary);
      break;
    case kRegexpNoWordBoundary:
      param_2_local = EmptyWidth(this,kEmptyNonWordBoundary);
      break;
    case kRegexpBeginText:
      EVar13 = kEmptyBeginText;
      if ((this->reversed_ & 1U) != 0) {
        EVar13 = kEmptyEndText;
      }
      param_2_local = EmptyWidth(this,EVar13);
      break;
    case kRegexpEndText:
      EVar13 = kEmptyEndText;
      if ((this->reversed_ & 1U) != 0) {
        EVar13 = kEmptyBeginText;
      }
      param_2_local = EmptyWidth(this,EVar13);
      break;
    case kRegexpCharClass:
      local_e0 = Regexp::cc(re);
      bVar3 = CharClass::empty(local_e0);
      if (bVar3) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_260,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/compile.cc"
                   ,0x3a3);
        poVar12 = LogMessage::stream(&local_260);
        std::operator<<(poVar12,"No ranges in char class");
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_260);
        this->failed_ = true;
        param_2_local = NoMatch(this);
      }
      else {
        i_3._3_1_ = CharClass::FoldsASCII(local_e0);
        BeginRange(this);
        for (pRStack_278 = CharClass::begin(local_e0); pRVar1 = pRStack_278,
            pRVar11 = CharClass::end(local_e0), pRVar1 != pRVar11; pRStack_278 = pRStack_278 + 1) {
          if ((((i_3._3_1_ & 1) == 0) || (pRStack_278->lo < 0x41)) || (0x5a < pRStack_278->hi)) {
            local_279 = (bool)(i_3._3_1_ & 1);
            if ((((pRStack_278->lo < 0x42) && (0x79 < pRStack_278->hi)) ||
                ((pRStack_278->hi < 0x41 || (0x7a < pRStack_278->lo)))) ||
               ((0x5a < pRStack_278->lo && (pRStack_278->hi < 0x61)))) {
              local_279 = false;
            }
            AddRuneRange(this,pRStack_278->lo,pRStack_278->hi,local_279);
          }
        }
        param_2_local = EndRange(this);
      }
      break;
    case kMaxRegexpOp:
      iVar5 = Regexp::match_id(re);
      param_2_local = Match(this,iVar5);
      if (this->anchor_ != ANCHOR_BOTH) {
        FVar8 = DotStar(this);
        FVar9 = EmptyWidth(this,kEmptyEndText);
        FVar9 = Cat(this,FVar9,param_2_local);
        param_2_local = Cat(this,FVar8,FVar9);
      }
    }
  }
  else {
    param_2_local = NoMatch(this);
  }
  return param_2_local;
}

Assistant:

Frag Compiler::PostVisit(Regexp* re, Frag, Frag, Frag* child_frags,
                         int nchild_frags) {
  // If a child failed, don't bother going forward, especially
  // since the child_frags might contain Frags with NULLs in them.
  if (failed_)
    return NoMatch();

  // Given the child fragments, return the fragment for this node.
  switch (re->op()) {
    case kRegexpRepeat:
      // Should not see; code at bottom of function will print error
      break;

    case kRegexpNoMatch:
      return NoMatch();

    case kRegexpEmptyMatch:
      return Nop();

    case kRegexpHaveMatch: {
      Frag f = Match(re->match_id());
      // Remember unanchored match to end of string.
      if (anchor_ != RE2::ANCHOR_BOTH)
        f = Cat(DotStar(), Cat(EmptyWidth(kEmptyEndText), f));
      return f;
    }

    case kRegexpConcat: {
      Frag f = child_frags[0];
      for (int i = 1; i < nchild_frags; i++)
        f = Cat(f, child_frags[i]);
      return f;
    }

    case kRegexpAlternate: {
      Frag f = child_frags[0];
      for (int i = 1; i < nchild_frags; i++)
        f = Alt(f, child_frags[i]);
      return f;
    }

    case kRegexpStar:
      return Star(child_frags[0], (re->parse_flags()&Regexp::NonGreedy) != 0);

    case kRegexpPlus:
      return Plus(child_frags[0], (re->parse_flags()&Regexp::NonGreedy) != 0);

    case kRegexpQuest:
      return Quest(child_frags[0], (re->parse_flags()&Regexp::NonGreedy) != 0);

    case kRegexpLiteral:
      return Literal(re->rune(), (re->parse_flags()&Regexp::FoldCase) != 0);

    case kRegexpLiteralString: {
      // Concatenation of literals.
      if (re->nrunes() == 0)
        return Nop();
      Frag f;
      for (int i = 0; i < re->nrunes(); i++) {
        Frag f1 = Literal(re->runes()[i],
                          (re->parse_flags()&Regexp::FoldCase) != 0);
        if (i == 0)
          f = f1;
        else
          f = Cat(f, f1);
      }
      return f;
    }

    case kRegexpAnyChar:
      BeginRange();
      AddRuneRange(0, Runemax, false);
      return EndRange();

    case kRegexpAnyByte:
      return ByteRange(0x00, 0xFF, false);

    case kRegexpCharClass: {
      CharClass* cc = re->cc();
      if (cc->empty()) {
        // This can't happen.
        LOG(DFATAL) << "No ranges in char class";
        failed_ = true;
        return NoMatch();
      }

      // ASCII case-folding optimization: if the char class
      // behaves the same on A-Z as it does on a-z,
      // discard any ranges wholly contained in A-Z
      // and mark the other ranges as foldascii.
      // This reduces the size of a program for
      // (?i)abc from 3 insts per letter to 1 per letter.
      bool foldascii = cc->FoldsASCII();

      // Character class is just a big OR of the different
      // character ranges in the class.
      BeginRange();
      for (CharClass::iterator i = cc->begin(); i != cc->end(); ++i) {
        // ASCII case-folding optimization (see above).
        if (foldascii && 'A' <= i->lo && i->hi <= 'Z')
          continue;

        // If this range contains all of A-Za-z or none of it,
        // the fold flag is unnecessary; don't bother.
        bool fold = foldascii;
        if ((i->lo <= 'A' && 'z' <= i->hi) || i->hi < 'A' || 'z' < i->lo ||
            ('Z' < i->lo && i->hi < 'a'))
          fold = false;

        AddRuneRange(i->lo, i->hi, fold);
      }
      return EndRange();
    }

    case kRegexpCapture:
      // If this is a non-capturing parenthesis -- (?:foo) --
      // just use the inner expression.
      if (re->cap() < 0)
        return child_frags[0];
      return Capture(child_frags[0], re->cap());

    case kRegexpBeginLine:
      return EmptyWidth(reversed_ ? kEmptyEndLine : kEmptyBeginLine);

    case kRegexpEndLine:
      return EmptyWidth(reversed_ ? kEmptyBeginLine : kEmptyEndLine);

    case kRegexpBeginText:
      return EmptyWidth(reversed_ ? kEmptyEndText : kEmptyBeginText);

    case kRegexpEndText:
      return EmptyWidth(reversed_ ? kEmptyBeginText : kEmptyEndText);

    case kRegexpWordBoundary:
      return EmptyWidth(kEmptyWordBoundary);

    case kRegexpNoWordBoundary:
      return EmptyWidth(kEmptyNonWordBoundary);
  }
  LOG(DFATAL) << "Missing case in Compiler: " << re->op();
  failed_ = true;
  return NoMatch();
}